

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O3

void __thiscall
TEST_MockSupport_c_whenNoReturnValueIsGivenReturnDoubleValueOrDefaultShouldlUseTheDefaultValue_Test
::testBody(TEST_MockSupport_c_whenNoReturnValueIsGivenReturnDoubleValueOrDefaultShouldlUseTheDefaultValue_Test
           *this)

{
  MockSupport_c *pMVar1;
  UtestShell *pUVar2;
  MockActualCall_c *pMVar3;
  TestTerminator *pTVar4;
  double dVar5;
  
  pMVar1 = mock_c();
  (*pMVar1->expectOneCall)("foo");
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = mock_c();
  pMVar3 = (*pMVar1->actualCall)("foo");
  dVar5 = (*pMVar3->returnDoubleValueOrDefault)(2.2);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x15])
            (0x400199999999999a,dVar5,0x3f747ae147ae147b,pUVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0x1da,pTVar4);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = mock_c();
  dVar5 = (*pMVar1->returnDoubleValueOrDefault)(2.2);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x15])
            (0x400199999999999a,dVar5,0x3f747ae147ae147b,pUVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0x1db,pTVar4,pUVar2->_vptr_UtestShell[0x15]);
  return;
}

Assistant:

TEST(MockSupport_c, whenNoReturnValueIsGivenReturnDoubleValueOrDefaultShouldlUseTheDefaultValue)
{
    double defaultValue = 2.2;
    mock_c()->expectOneCall("foo");
    DOUBLES_EQUAL(defaultValue, mock_c()->actualCall("foo")->returnDoubleValueOrDefault(defaultValue), 0.005);
    DOUBLES_EQUAL(defaultValue, mock_c()->returnDoubleValueOrDefault(defaultValue), 0.005);
}